

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O2

_Bool bitset_container_remove(bitset_container_t *bitset,uint16_t pos)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint uVar3;
  undefined2 in_register_00000032;
  
  puVar1 = bitset->words;
  uVar3 = CONCAT22(in_register_00000032,pos) >> 6;
  uVar2 = puVar1[uVar3];
  bitset->cardinality =
       bitset->cardinality -
       (uint)((uVar2 >> ((ulong)CONCAT22(in_register_00000032,pos) & 0x3f) & 1) != 0);
  puVar1[uVar3] = uVar2 & ~(1L << ((ulong)CONCAT22(in_register_00000032,pos) & 0x3f));
  return SUB81(puVar1,0);
}

Assistant:

static inline bool bitset_container_remove(bitset_container_t *bitset,
                                           uint16_t pos) {
    const uint64_t old_word = bitset->words[pos >> 6];
    const int index = pos & 63;
    const uint64_t new_word = old_word & (~(UINT64_C(1) << index));
    const uint64_t increment = (old_word ^ new_word) >> index;
    bitset->cardinality -= (uint32_t)increment;
    bitset->words[pos >> 6] = new_word;
    return increment > 0;
}